

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder * __thiscall
capnp::_::OrphanBuilder::asText(Builder *__return_storage_ptr__,OrphanBuilder *this)

{
  bool bVar1;
  WirePointer *pWVar2;
  Fault local_40;
  Fault f;
  undefined1 local_30 [8];
  DebugComparison<bool,_bool> _kjCondition;
  OrphanBuilder *this_local;
  
  _kjCondition._24_8_ = this;
  pWVar2 = tagAsPtr(this);
  f.exception._6_1_ = WirePointer::isNull(pWVar2);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  f.exception._5_1_ = this->location == (word *)0x0;
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_30,
             (DebugExpression<bool> *)((long)&f.exception + 7),(bool *)((long)&f.exception + 5));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<bool,bool>&>
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xe2d,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","_kjCondition,",
               (DebugComparison<bool,_bool> *)local_30);
    kj::_::Debug::Fault::fatal(&local_40);
  }
  pWVar2 = tagAsPtr(this);
  WireHelpers::getWritableTextPointer
            (__return_storage_ptr__,pWVar2,this->location,this->segment,this->capTable,(void *)0x0,0
            );
  return __return_storage_ptr__;
}

Assistant:

Text::Builder OrphanBuilder::asText() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  // Never relocates.
  return WireHelpers::getWritableTextPointer(
      tagAsPtr(), location, segment, capTable, nullptr, ZERO * BYTES);
}